

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O1

void curses_update_status(nh_player_info *pi)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  nh_bool nVar4;
  WINDOW *pWVar5;
  attr_t aVar6;
  size_t sVar7;
  __int32_t **pp_Var8;
  long in_RCX;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  long oldv;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  nh_bool nVar15;
  dgn_name_value dVar16;
  int nh_color;
  int iVar17;
  nh_player_info *pnVar18;
  char *pcVar19;
  wchar_t stat_ch_col;
  char buf [80];
  uint local_90;
  undefined4 local_8c;
  byte local_88 [88];
  
  curses_update_status_silent(pi);
  iVar17 = player.max_rank_sz;
  nVar4 = ui_flags.status3;
  if (player.x == 0) {
    return;
  }
  if (settings.classic_status != '\0') {
    sVar7 = strlen(player.plname);
    sprintf((char *)local_88,"%.10s the %-*s  ",&player,(ulong)((iVar17 - (int)sVar7) + 8),0x1309ac)
    ;
    pp_Var8 = __ctype_toupper_loc();
    local_88[0] = *(byte *)(*pp_Var8 + local_88[0]);
    wmove(statuswin,0,0);
    iVar2 = player.hpmax;
    iVar17 = player.hp;
    sVar7 = strlen((char *)local_88);
    uVar14 = (uint)sVar7;
    uVar9 = sVar7 & 0xffffffff;
    uVar12 = uVar14 + 1;
    do {
      uVar13 = (int)uVar14 >> 0x1f & uVar14;
      if ((int)uVar9 < 1) break;
      uVar12 = uVar12 - 1;
      lVar10 = uVar9 - 1;
      uVar9 = uVar9 - 1;
      uVar13 = uVar12;
    } while (local_88[lVar10] == 0x20);
    uVar14 = 0;
    if (0 < iVar17 && 0 < iVar2) {
      uVar14 = (int)(uVar13 * iVar17) / iVar2;
    }
    nh_color = 7;
    if (iVar17 != iVar2) {
      iVar1 = iVar17 * 3;
      nh_color = 2;
      if ((iVar1 == iVar2 * 2 || SBORROW4(iVar1,iVar2 * 2) != iVar1 + iVar2 * -2 < 0) &&
         (nh_color = 3, iVar1 <= iVar2)) {
        nh_color = (uint)(iVar2 < iVar17 * 7) * 8 + 1;
      }
    }
    if ((int)uVar13 <= (int)uVar14) {
      uVar14 = uVar13;
    }
    aVar6 = curses_color_attr(nh_color,0);
    waddch(statuswin,0x5b);
    wattr_on(statuswin,aVar6,0);
    wattr_on(statuswin,0x40000,0);
    wprintw(statuswin,"%.*s",uVar14,local_88);
    wattr_off(statuswin,0x40000,0);
    wprintw(statuswin,"%.*s",uVar13 - uVar14,local_88 + (int)uVar14);
    wattr_off(statuswin,aVar6,0);
    waddch(statuswin,0x5d);
    waddnstr(statuswin," ",0xffffffff);
    status_change_color_on
              (&local_8c,&local_90,(long)old_player.st,(long)old_player.st_extra,(long)player.st,
               (long)player.st_extra);
    waddnstr(statuswin,"St:",0xffffffff);
    if ((player.st == 0x12) && (player.st_extra != 0)) {
      if (player.st_extra < 100) {
        wprintw(statuswin,"18/%02d",player.st_extra);
      }
      else {
        wprintw(statuswin,"18/**");
      }
    }
    else {
      wprintw(statuswin,"%-1d");
    }
    if (local_8c != L'\0') {
      wattr_off(statuswin,local_90,0);
    }
    print_statdiff(" ","Dx:%-1d",(long)old_player.dx,(long)player.dx);
    print_statdiff(" ","Co:%-1d",(long)old_player.co,(long)player.co);
    print_statdiff(" ","In:%-1d",(long)old_player.in,(long)player.in);
    print_statdiff(" ","Wi:%-1d",(long)old_player.wi,(long)player.wi);
    print_statdiff(" ","Ch:%-1d",(long)old_player.ch,(long)player.ch);
    pcVar11 = " Lawful";
    if (player.align == 0) {
      pcVar11 = " Neutral";
    }
    pcVar19 = " Chaotic";
    if (player.align != -1) {
      pcVar19 = pcVar11;
    }
    wprintw(statuswin,pcVar19);
    if (settings.showscore != '\0') {
      print_statdiff(" ","S:%ld",(long)old_player.score,(long)player.score);
    }
    wclrtoeol(statuswin);
    dVar16 = DGN_NAME_SHORT;
    wmove(statuswin,1,0);
    draw_dungeon_name((nh_player_info *)0x0,dVar16);
    waddnstr(statuswin," ",0xffffffff);
    status_change_color_on(&local_8c,&local_90,(long)old_player.gold,0,(long)player.gold,0);
    wprintw(statuswin,"%c:%-2ld",(int)player.coinsym,player.gold);
    if (local_8c != L'\0') {
      wattr_off(statuswin,local_90,0);
    }
    waddnstr(statuswin," HP:",0xffffffff);
    if (player.hp * 7 < player.hpmax) {
      wattr_on(statuswin,0x40000,0);
    }
    iVar17 = 7;
    if (player.hp != player.hpmax) {
      iVar2 = player.hp * 3;
      iVar17 = 2;
      if ((iVar2 == player.hpmax * 2 ||
           SBORROW4(iVar2,player.hpmax * 2) != iVar2 + player.hpmax * -2 < 0) &&
         (iVar17 = 3, iVar2 <= player.hpmax)) {
        iVar17 = (uint)(player.hpmax < player.hp * 7) * 8 + 1;
      }
    }
    aVar6 = curses_color_attr(iVar17,0);
    local_90 = aVar6;
    wattr_on(statuswin,aVar6,0);
    wprintw(statuswin,"%d(%d)",player.hp,player.hpmax);
    wattr_off(statuswin,aVar6,0);
    if (player.hp * 7 < player.hpmax) {
      wattr_off(statuswin,0x40000,0);
    }
    waddnstr(statuswin," Pw:",0xffffffff);
    uVar14 = 7;
    if (player.en != player.enmax) {
      iVar17 = player.en * 3;
      uVar14 = 2;
      if ((iVar17 == player.enmax * 2 ||
           SBORROW4(iVar17,player.enmax * 2) != iVar17 + player.enmax * -2 < 0) &&
         (uVar14 = 6, iVar17 <= player.enmax)) {
        uVar14 = player.enmax < player.en * 7 | 4;
      }
    }
    aVar6 = curses_color_attr(uVar14,0);
    local_90 = aVar6;
    wattr_on(statuswin,aVar6,0);
    uVar9 = (ulong)(uint)player.enmax;
    wprintw(statuswin,"%d(%d)",player.en);
    wattr_off(statuswin,aVar6,0);
    print_statdiffr("AC:%-2d",(char *)(long)old_player.ac,(long)player.ac,uVar9);
    if (player.monnum == player.cur_monnum) {
      oldv = (long)old_player.level;
      lVar10 = (long)player.level;
      pcVar19 = " ";
      if (settings.showexp == '\0') {
        pcVar11 = "Exp:%u";
      }
      else {
        print_statdiff(" ","Xp:%u",oldv,lVar10);
        oldv = (long)old_player.xp;
        lVar10 = (long)player.xp;
        pcVar19 = "/";
        pcVar11 = "%-1ld";
      }
    }
    else {
      oldv = (long)old_player.level;
      lVar10 = (long)player.level;
      pcVar19 = " ";
      pcVar11 = "HD:%d";
    }
    print_statdiff(pcVar19,pcVar11,oldv,lVar10);
    nVar15 = 'Z';
    pnVar18 = (nh_player_info *)statuswin;
    waddnstr(statuswin," ",0xffffffff);
    draw_time(pnVar18);
    wclrtoeol(statuswin);
    if (nVar4 != '\0') {
      nVar15 = '\x02';
      wmove(statuswin,2,0);
      wclrtoeol(statuswin);
    }
    draw_statuses((nh_player_info *)(ulong)(uint)(int)nVar4,nVar15);
    goto LAB_001172bb;
  }
  wmove(statuswin,ui_flags.status3 != '\0',0);
  draw_bar(player.hp,player.hpmax,L'\x01',(nh_bool)in_RCX);
  print_statdiffr("AC:%d",(char *)(long)old_player.ac,(long)player.ac,in_RCX);
  lVar10 = (long)player.level;
  pcVar11 = "HD:%d";
  if (player.monnum == player.cur_monnum) {
    pcVar11 = "Xp:%d";
  }
  print_statdiff(" ",pcVar11,(long)old_player.level,lVar10);
  nVar15 = (nh_bool)lVar10;
  if (((nVar4 != '\0') && (settings.showexp != '\0')) && (player.monnum == player.cur_monnum)) {
    waddnstr(statuswin,"(",0xffffffff);
    lVar10 = (long)old_player.xp;
    status_change_color_on
              (&local_8c,&local_90,(long)old_player.level,lVar10,(long)player.level,(long)player.xp)
    ;
    nVar15 = (nh_bool)lVar10;
    wprintw(statuswin,"%ld",player.xp_next - player.xp);
    if (local_8c != L'\0') {
      wattr_off(statuswin,local_90,0);
    }
    waddnstr(statuswin,")",0xffffffff);
  }
  pcVar11 = " ";
  dVar16 = 0x11905a;
  waddnstr(statuswin," ",0xffffffff);
  uVar14 = 2 - (nVar4 == '\0');
  draw_dungeon_name((nh_player_info *)(ulong)uVar14,dVar16);
  wclrtoeol(statuswin);
  wmove(statuswin,uVar14,0);
  draw_bar(player.en,player.enmax,L'\0',nVar15);
  waddnstr(statuswin," ",0xffffffff);
  status_change_color_on(&local_8c,&local_90,(long)old_player.gold,0,(long)player.gold,0);
  nVar15 = 'V';
  wprintw(statuswin,"%c%ld",(int)player.coinsym,player.gold);
  if (local_8c != L'\0') {
    uVar9 = (ulong)local_90;
    wattr_off(statuswin,uVar9,0);
    nVar15 = (nh_bool)uVar9;
  }
  if (settings.showscore != '\0') {
    nVar15 = '\x13';
    print_statdiff(" ","S:%ld",(long)old_player.score,(long)player.score);
  }
  if (settings.time != '\0') {
    nVar15 = 'Z';
    pnVar18 = (nh_player_info *)statuswin;
    waddnstr(statuswin," ",0xffffffff);
    draw_time(pnVar18);
  }
  wclrtoeol(statuswin);
  draw_statuses((nh_player_info *)(ulong)(uint)(int)nVar4,nVar15);
  if (nVar4 == '\0') {
    sprintf((char *)local_88,"%.12s, %s",&player,0x1309ac);
    pWVar5 = statuswin;
    if (statuswin == (WINDOW *)0x0) {
      iVar17 = -1;
    }
    else {
      iVar17 = statuswin->_maxx + 1;
    }
    sVar7 = strlen((char *)local_88);
    wmove(pWVar5,0,iVar17 - (int)sVar7);
  }
  else {
    pcVar19 = " Lawful";
    if (player.align == 0) {
      pcVar19 = " Neutral";
    }
    pcVar3 = " Chaotic";
    if (player.align != -1) {
      pcVar3 = pcVar19;
    }
    pcVar19 = (char *)0x13099c;
    if (player.monnum != player.cur_monnum) {
      pcVar19 = "";
      pcVar11 = "";
    }
    sprintf((char *)local_88,"%.12s the %s %s%s%s",&player,pcVar3 + 1,pcVar19,pcVar11,0x1309ac);
    wmove(statuswin,0,0);
  }
  wprintw(statuswin,"%s",local_88);
  wclrtoeol(statuswin);
  if (nVar4 == '\0') goto LAB_001172bb;
  status_change_color_on
            (&local_8c,&local_90,(long)old_player.st,(long)old_player.st_extra,(long)player.st,
             (long)player.st_extra);
  if ((player.st == 0x12) && (player.st_extra != 0)) {
    if (statuswin == (WINDOW *)0x0) {
      iVar17 = -0x15;
    }
    else {
      iVar17 = statuswin->_maxx + -0x13;
    }
    wmove(statuswin,0,iVar17);
    if (player.st_extra != 100) {
      pcVar11 = "St:18/%02d";
      iVar17 = player.st_extra;
      goto LAB_001171a5;
    }
    waddnstr(statuswin,"St:18/**",0xffffffff);
  }
  else {
    if (statuswin == (WINDOW *)0x0) {
      iVar17 = -0x12;
    }
    else {
      iVar17 = statuswin->_maxx + -0x10;
    }
    wmove(statuswin,0,iVar17);
    pcVar11 = "St:%-2d";
    iVar17 = player.st;
LAB_001171a5:
    wprintw(statuswin,pcVar11,iVar17);
  }
  if (local_8c != L'\0') {
    wattr_off(statuswin,local_90,0);
  }
  print_statdiff(" ","Dx:%-2d",(long)old_player.dx,(long)player.dx);
  print_statdiff(" ","Co:%-2d",(long)old_player.co,(long)player.co);
  uVar14 = (uint)(player.st_extra == 0 || player.st != 0x12);
  if (statuswin == (WINDOW *)0x0) {
    iVar17 = uVar14 * 3 + -0x15;
  }
  else {
    iVar17 = (int)statuswin->_maxx + uVar14 * 3 + -0x13;
  }
  wmove(statuswin,1,iVar17);
  print_statdiff((char *)0x0,"In:%-2d",(long)old_player.in,(long)player.in);
  if (statuswin == (WINDOW *)0x0) {
    iVar17 = -0xc;
  }
  else {
    iVar17 = statuswin->_maxx + -10;
  }
  wmove(statuswin,1,iVar17);
  print_statdiff((char *)0x0,"Wi:%-2d",(long)old_player.wi,(long)player.wi);
  print_statdiff(" ","Ch:%-2d",(long)old_player.ch,(long)player.ch);
LAB_001172bb:
  wmove(mapwin,player.y,player.x + -1);
  if ((ui_flags.draw_frame != '\0') && (settings.frame_hp_color != '\0')) {
    redraw_frame();
  }
  wnoutrefresh(statuswin);
  return;
}

Assistant:

void curses_update_status(struct nh_player_info *pi)
{
    curses_update_status_silent(pi);

    if (player.x == 0)
	return; /* called before the game is running */

    if (settings.classic_status)
	classic_status(&player, ui_flags.status3);
    else
	draw_status_lines(&player, ui_flags.status3);

    /* prevent the cursor from flickering in the status line */
    wmove(mapwin, player.y, player.x - 1);

    /* if HP changes, frame color may change */
    if (ui_flags.draw_frame && settings.frame_hp_color)
	redraw_frame();

    wnoutrefresh(statuswin);
}